

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int memjrnlTruncate(sqlite3_file *pJfd,sqlite_int64 size)

{
  long local_30;
  i64 iOff;
  FileChunk *pIter;
  MemJournal *p;
  sqlite_int64 size_local;
  sqlite3_file *pJfd_local;
  
  if (size < (long)pJfd[3].pMethods) {
    iOff = 0;
    if (size == 0) {
      memjrnlFreeChunks((FileChunk *)pJfd[2].pMethods);
      pJfd[2].pMethods = (sqlite3_io_methods *)0x0;
    }
    else {
      local_30 = (long)*(int *)&pJfd[1].pMethods;
      for (iOff = (i64)pJfd[2].pMethods; iOff != 0 && local_30 < size; iOff = *(i64 *)iOff) {
        local_30 = *(int *)&pJfd[1].pMethods + local_30;
      }
      if (iOff != 0) {
        memjrnlFreeChunks(*(FileChunk **)iOff);
        *(undefined8 *)iOff = 0;
      }
    }
    pJfd[4].pMethods = (sqlite3_io_methods *)iOff;
    pJfd[3].pMethods = (sqlite3_io_methods *)size;
    pJfd[6].pMethods = (sqlite3_io_methods *)0x0;
    pJfd[5].pMethods = (sqlite3_io_methods *)0x0;
  }
  return 0;
}

Assistant:

static int memjrnlTruncate(sqlite3_file *pJfd, sqlite_int64 size){
  MemJournal *p = (MemJournal *)pJfd;
  assert( p->endpoint.pChunk==0 || p->endpoint.pChunk->pNext==0 );
  if( size<p->endpoint.iOffset ){
    FileChunk *pIter = 0;
    if( size==0 ){
      memjrnlFreeChunks(p->pFirst);
      p->pFirst = 0;
    }else{
      i64 iOff = p->nChunkSize;
      for(pIter=p->pFirst; ALWAYS(pIter) && iOff<size; pIter=pIter->pNext){
        iOff += p->nChunkSize;
      }
      if( ALWAYS(pIter) ){
        memjrnlFreeChunks(pIter->pNext);
        pIter->pNext = 0;
      }
    }

    p->endpoint.pChunk = pIter;
    p->endpoint.iOffset = size;
    p->readpoint.pChunk = 0;
    p->readpoint.iOffset = 0;
  }
  return SQLITE_OK;
}